

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_TrailerFieldNodeMissingNameAttribute::
TestreadFromDocument_TrailerFieldNodeMissingNameAttribute
          (TestreadFromDocument_TrailerFieldNodeMissingNameAttribute *this)

{
  char *suiteName;
  TestreadFromDocument_TrailerFieldNodeMissingNameAttribute *this_local;
  
  suiteName = SuiteDataDictionaryTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"readFromDocument_TrailerFieldNodeMissingNameAttribute",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/DataDictionaryTestCase.cpp"
             ,0x59c);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestreadFromDocument_TrailerFieldNodeMissingNameAttribute_00456fb0;
  return;
}

Assistant:

TEST(readFromDocument_TrailerFieldNodeMissingNameAttribute) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml =
      "<fix type='FIX' major='4' minor='2' servicepack='0'>"
        "<header>"
          "<field name='BeginString' required='Y' />"
        "</header>"
        "<fields>"
          "<field number='8' name='BeginString' type='STRING' >"
            "<value enum='1' description='SINGLE_SECURITY' />"
          "</field>"
        "</fields>"
        "<trailer>"
          "<field required='Y' />" // name attribute missing
        "</trailer>"
      "</fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}